

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
           *this)

{
  LinearPartHandler linear_expr;
  bool bVar1;
  int iVar2;
  int iVar3;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter> *in_RDI;
  LinearConHandler LVar4;
  int num_terms;
  int index;
  AlgebraicConHandler lh;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
  *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  AlgebraicConHandler *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  AlgebraicConHandler local_10 [2];
  
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
  AlgebraicConHandler::AlgebraicConHandler
            ((AlgebraicConHandler *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
  AlgebraicConHandler::num_items(local_10);
  iVar2 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
          ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                    *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
  iVar3 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
          ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
                    *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
  bVar1 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
          AlgebraicConHandler::SkipExpr(local_10,iVar2);
  if (bVar1) {
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
    ReadLinearExpr<mp::internal::NullLinearExprHandler>(in_RDI,iVar3);
  }
  else {
    LVar4 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
            AlgebraicConHandler::OnLinearExpr
                      (in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    linear_expr.obj_index = in_stack_ffffffffffffffd0;
    linear_expr.num_terms = (int)LVar4._8_8_;
    linear_expr.nonlinear_expr_id = (int)((ulong)LVar4._8_8_ >> 0x20);
    linear_expr._12_4_ = LVar4.num_terms;
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
    ReadLinearExpr<ExprPrinter::LinearPartHandler>
              (LVar4._0_8_,(int)((ulong)in_RDI >> 0x20),linear_expr);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}